

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O1

string * stringformat<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
                   (string *__return_storage_ptr__,char *fmt,
                   vector<unsigned_char,_std::allocator<unsigned_char>_> *args)

{
  stringstream buf;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  StringFormatter<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>::
  format<std::vector<unsigned_char,std::allocator<unsigned_char>>const>(local_190,fmt,args);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string stringformat(const char *fmt, ARGS&&...args)
{
    std::stringstream buf;
    buf << StringFormatter<ARGS...>(fmt, std::forward<ARGS>(args)...);

    return buf.str();
}